

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

OPJ_BOOL opj_dwt_encode_procedure
                   (opj_thread_pool_t *tp,opj_tcd_tilecomp_t *tilec,
                   opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v,
                   opj_encode_and_deinterleave_h_one_row_fnptr_type
                   p_encode_and_deinterleave_h_one_row)

{
  OPJ_INT32 *pOVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  size_t size;
  void *ptr;
  long *plVar13;
  void *pvVar14;
  uint local_c4;
  opj_dwt_encode_h_job_t *job_1;
  OPJ_UINT32 step_j_1;
  OPJ_UINT32 num_jobs_1;
  OPJ_INT32 *aj;
  opj_dwt_encode_v_job_t *job;
  uint local_98;
  OPJ_UINT32 step_j;
  OPJ_UINT32 num_jobs;
  OPJ_INT32 sn;
  OPJ_INT32 dn;
  OPJ_INT32 cas_row;
  OPJ_INT32 cas_col;
  OPJ_UINT32 rh1;
  OPJ_UINT32 rw1;
  OPJ_UINT32 rh;
  OPJ_UINT32 rw;
  OPJ_UINT32 j;
  OPJ_INT32 *tiledp;
  opj_tcd_resolution_t *poStack_60;
  int num_threads;
  opj_tcd_resolution_t *l_last_res;
  opj_tcd_resolution_t *l_cur_res;
  OPJ_SIZE_T l_data_size;
  OPJ_INT32 l;
  OPJ_UINT32 w;
  OPJ_INT32 *bj;
  OPJ_INT32 i;
  opj_encode_and_deinterleave_h_one_row_fnptr_type p_encode_and_deinterleave_h_one_row_local;
  opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v_local;
  opj_tcd_tilecomp_t *tilec_local;
  opj_thread_pool_t *tp_local;
  
  uVar2 = opj_thread_pool_get_thread_count(tp);
  pOVar1 = tilec->data;
  OVar3 = tilec->x1 - tilec->x0;
  bj._4_4_ = tilec->numresolutions - 1;
  l_last_res = tilec->resolutions + bj._4_4_;
  OVar4 = opj_dwt_max_resolution(tilec->resolutions,tilec->numresolutions);
  uVar12 = (ulong)OVar4;
  if (uVar12 < 0x800000000000000) {
    size = uVar12 << 5;
    ptr = opj_aligned_32_malloc(size);
    if ((uVar12 == 0) || (ptr != (void *)0x0)) {
      while( true ) {
        poStack_60 = l_last_res + -1;
        if (bj._4_4_ == 0) break;
        uVar5 = l_last_res->x1 - l_last_res->x0;
        uVar6 = l_last_res->y1 - l_last_res->y0;
        iVar7 = l_last_res[-1].x1 - poStack_60->x0;
        iVar8 = l_last_res[-1].y1 - l_last_res[-1].y0;
        uVar9 = l_last_res->x0 & 1;
        uVar10 = l_last_res->y0 & 1;
        if (((int)uVar2 < 2) || (uVar5 < 0x10)) {
          for (rh = 0; rh + 7 < uVar5; rh = rh + 8) {
            (*p_encode_and_deinterleave_v)(pOVar1 + rh,ptr,uVar6,SUB14(uVar10 == 0,0),OVar3,8);
          }
          if (rh < uVar5) {
            (*p_encode_and_deinterleave_v)
                      (pOVar1 + rh,ptr,uVar6,SUB14(uVar10 == 0,0),OVar3,uVar5 - rh);
          }
        }
        else {
          local_98 = uVar2;
          if (uVar5 < uVar2) {
            local_98 = uVar5;
          }
          iVar11 = (int)((ulong)uVar5 / (ulong)local_98 >> 3) * 8;
          for (rh = 0; rh < local_98; rh = rh + 1) {
            plVar13 = (long *)opj_malloc(0x38);
            if (plVar13 == (long *)0x0) {
              opj_thread_pool_wait_completion(tp,0);
              opj_aligned_free(ptr);
              return 0;
            }
            pvVar14 = opj_aligned_32_malloc(size);
            *plVar13 = (long)pvVar14;
            if (*plVar13 == 0) {
              opj_thread_pool_wait_completion(tp,0);
              opj_free(plVar13);
              opj_aligned_free(ptr);
              return 0;
            }
            *(uint *)(plVar13 + 1) = uVar6 - iVar8;
            *(int *)((long)plVar13 + 0xc) = iVar8;
            *(uint *)(plVar13 + 2) = uVar10;
            *(uint *)(plVar13 + 3) = uVar6;
            *(OPJ_UINT32 *)((long)plVar13 + 0x1c) = OVar3;
            plVar13[4] = (long)pOVar1;
            *(OPJ_UINT32 *)(plVar13 + 5) = rh * iVar11;
            local_c4 = uVar5;
            if (rh + 1 != local_98) {
              local_c4 = (rh + 1) * iVar11;
            }
            *(uint *)((long)plVar13 + 0x2c) = local_c4;
            plVar13[6] = (long)p_encode_and_deinterleave_v;
            opj_thread_pool_submit_job(tp,opj_dwt_encode_v_func,plVar13);
          }
          opj_thread_pool_wait_completion(tp,0);
        }
        if (((int)uVar2 < 2) || (uVar6 < 2)) {
          for (rh = 0; rh < uVar6; rh = rh + 1) {
            (*p_encode_and_deinterleave_h_one_row)
                      (pOVar1 + rh * OVar3,ptr,uVar5,SUB14(uVar9 == 0,0));
          }
        }
        else {
          job_1._4_4_ = uVar2;
          if (uVar6 < uVar2) {
            job_1._4_4_ = uVar6;
          }
          for (rh = 0; rh < job_1._4_4_; rh = rh + 1) {
            plVar13 = (long *)opj_malloc(0x38);
            if (plVar13 == (long *)0x0) {
              opj_thread_pool_wait_completion(tp,0);
              opj_aligned_free(ptr);
              return 0;
            }
            pvVar14 = opj_aligned_32_malloc(size);
            *plVar13 = (long)pvVar14;
            if (*plVar13 == 0) {
              opj_thread_pool_wait_completion(tp,0);
              opj_free(plVar13);
              opj_aligned_free(ptr);
              return 0;
            }
            *(uint *)(plVar13 + 1) = uVar5 - iVar7;
            *(int *)((long)plVar13 + 0xc) = iVar7;
            *(uint *)(plVar13 + 2) = uVar9;
            *(uint *)(plVar13 + 3) = uVar5;
            *(OPJ_UINT32 *)((long)plVar13 + 0x1c) = OVar3;
            plVar13[4] = (long)pOVar1;
            *(OPJ_UINT32 *)(plVar13 + 5) = rh * (uVar6 / job_1._4_4_);
            *(OPJ_UINT32 *)((long)plVar13 + 0x2c) = (rh + 1) * (uVar6 / job_1._4_4_);
            if (rh == job_1._4_4_ - 1) {
              *(uint *)((long)plVar13 + 0x2c) = uVar6;
            }
            plVar13[6] = (long)p_encode_and_deinterleave_h_one_row;
            opj_thread_pool_submit_job(tp,opj_dwt_encode_h_func,plVar13);
          }
          opj_thread_pool_wait_completion(tp,0);
        }
        l_last_res = poStack_60;
        bj._4_4_ = bj._4_4_ + -1;
      }
      opj_aligned_free(ptr);
      tp_local._4_4_ = 1;
    }
    else {
      tp_local._4_4_ = 0;
    }
  }
  else {
    tp_local._4_4_ = 0;
  }
  return tp_local._4_4_;
}

Assistant:

static INLINE OPJ_BOOL opj_dwt_encode_procedure(opj_thread_pool_t* tp,
        opj_tcd_tilecomp_t * tilec,
        opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v,
        opj_encode_and_deinterleave_h_one_row_fnptr_type
        p_encode_and_deinterleave_h_one_row)
{
    OPJ_INT32 i;
    OPJ_INT32 *bj = 00;
    OPJ_UINT32 w;
    OPJ_INT32 l;

    OPJ_SIZE_T l_data_size;

    opj_tcd_resolution_t * l_cur_res = 0;
    opj_tcd_resolution_t * l_last_res = 0;
    const int num_threads = opj_thread_pool_get_thread_count(tp);
    OPJ_INT32 * OPJ_RESTRICT tiledp = tilec->data;

    w = (OPJ_UINT32)(tilec->x1 - tilec->x0);
    l = (OPJ_INT32)tilec->numresolutions - 1;

    l_cur_res = tilec->resolutions + l;
    l_last_res = l_cur_res - 1;

    l_data_size = opj_dwt_max_resolution(tilec->resolutions, tilec->numresolutions);
    /* overflow check */
    if (l_data_size > (SIZE_MAX / (NB_ELTS_V8 * sizeof(OPJ_INT32)))) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    l_data_size *= NB_ELTS_V8 * sizeof(OPJ_INT32);
    bj = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
    /* l_data_size is equal to 0 when numresolutions == 1 but bj is not used */
    /* in that case, so do not error out */
    if (l_data_size != 0 && ! bj) {
        return OPJ_FALSE;
    }
    i = l;

    while (i--) {
        OPJ_UINT32 j;
        OPJ_UINT32 rw;           /* width of the resolution level computed   */
        OPJ_UINT32 rh;           /* height of the resolution level computed  */
        OPJ_UINT32
        rw1;      /* width of the resolution level once lower than computed one                                       */
        OPJ_UINT32
        rh1;      /* height of the resolution level once lower than computed one                                      */
        OPJ_INT32 cas_col;  /* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
        OPJ_INT32 cas_row;  /* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
        OPJ_INT32 dn, sn;

        rw  = (OPJ_UINT32)(l_cur_res->x1 - l_cur_res->x0);
        rh  = (OPJ_UINT32)(l_cur_res->y1 - l_cur_res->y0);
        rw1 = (OPJ_UINT32)(l_last_res->x1 - l_last_res->x0);
        rh1 = (OPJ_UINT32)(l_last_res->y1 - l_last_res->y0);

        cas_row = l_cur_res->x0 & 1;
        cas_col = l_cur_res->y0 & 1;

        sn = (OPJ_INT32)rh1;
        dn = (OPJ_INT32)(rh - rh1);

        /* Perform vertical pass */
        if (num_threads <= 1 || rw < 2 * NB_ELTS_V8) {
            for (j = 0; j + NB_ELTS_V8 - 1 < rw; j += NB_ELTS_V8) {
                p_encode_and_deinterleave_v(tiledp + j,
                                            bj,
                                            rh,
                                            cas_col == 0,
                                            w,
                                            NB_ELTS_V8);
            }
            if (j < rw) {
                p_encode_and_deinterleave_v(tiledp + j,
                                            bj,
                                            rh,
                                            cas_col == 0,
                                            w,
                                            rw - j);
            }
        }  else {
            OPJ_UINT32 num_jobs = (OPJ_UINT32)num_threads;
            OPJ_UINT32 step_j;

            if (rw < num_jobs) {
                num_jobs = rw;
            }
            step_j = ((rw / num_jobs) / NB_ELTS_V8) * NB_ELTS_V8;

            for (j = 0; j < num_jobs; j++) {
                opj_dwt_encode_v_job_t* job;

                job = (opj_dwt_encode_v_job_t*) opj_malloc(sizeof(opj_dwt_encode_v_job_t));
                if (!job) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->v.mem = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
                if (!job->v.mem) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_free(job);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->v.dn = dn;
                job->v.sn = sn;
                job->v.cas = cas_col;
                job->rh = rh;
                job->w = w;
                job->tiledp = tiledp;
                job->min_j = j * step_j;
                job->max_j = (j + 1 == num_jobs) ? rw : (j + 1) * step_j;
                job->p_encode_and_deinterleave_v = p_encode_and_deinterleave_v;
                opj_thread_pool_submit_job(tp, opj_dwt_encode_v_func, job);
            }
            opj_thread_pool_wait_completion(tp, 0);
        }

        sn = (OPJ_INT32)rw1;
        dn = (OPJ_INT32)(rw - rw1);

        /* Perform horizontal pass */
        if (num_threads <= 1 || rh <= 1) {
            for (j = 0; j < rh; j++) {
                OPJ_INT32* OPJ_RESTRICT aj = tiledp + j * w;
                (*p_encode_and_deinterleave_h_one_row)(aj, bj, rw,
                                                       cas_row == 0 ? OPJ_TRUE : OPJ_FALSE);
            }
        }  else {
            OPJ_UINT32 num_jobs = (OPJ_UINT32)num_threads;
            OPJ_UINT32 step_j;

            if (rh < num_jobs) {
                num_jobs = rh;
            }
            step_j = (rh / num_jobs);

            for (j = 0; j < num_jobs; j++) {
                opj_dwt_encode_h_job_t* job;

                job = (opj_dwt_encode_h_job_t*) opj_malloc(sizeof(opj_dwt_encode_h_job_t));
                if (!job) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->h.mem = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
                if (!job->h.mem) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_free(job);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->h.dn = dn;
                job->h.sn = sn;
                job->h.cas = cas_row;
                job->rw = rw;
                job->w = w;
                job->tiledp = tiledp;
                job->min_j = j * step_j;
                job->max_j = (j + 1U) * step_j; /* this can overflow */
                if (j == (num_jobs - 1U)) {  /* this will take care of the overflow */
                    job->max_j = rh;
                }
                job->p_function = p_encode_and_deinterleave_h_one_row;
                opj_thread_pool_submit_job(tp, opj_dwt_encode_h_func, job);
            }
            opj_thread_pool_wait_completion(tp, 0);
        }

        l_cur_res = l_last_res;

        --l_last_res;
    }

    opj_aligned_free(bj);
    return OPJ_TRUE;
}